

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  uint uVar1;
  code *pcVar2;
  ImGuiContext *pIVar3;
  undefined1 uVar4;
  ImGuiKey key;
  ImGuiKey IVar5;
  ImGuiID IVar6;
  char *pcVar7;
  ImGuiKeyRoutingData *pIVar8;
  ImGuiID *pIVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  char *fmt;
  bool bVar14;
  
  pIVar3 = GImGui;
  uVar12 = flags | 0xd000;
  if ((flags & 0x3c00U) != 0) {
    uVar12 = flags;
  }
  key = FixupKeyChord(key_chord);
  if (pIVar3->DebugBreakInShortcutRouting == key) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return (bool)uVar4;
  }
  if (((uVar12 >> 0x10 & 1) != 0) && (pIVar3->NavWindow == (ImGuiWindow *)0x0)) {
    return false;
  }
  if ((uVar12 >> 0xd & 1) != 0) {
    bVar14 = true;
    if ((pIVar3->DebugLogFlags & 0x80) == 0) {
      return true;
    }
    pcVar7 = GetKeyChordName(key);
    fmt = "SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> always, no register\n";
LAB_00164e55:
    DebugLog(fmt,pcVar7,(ulong)uVar12,(ulong)owner_id);
    return bVar14;
  }
  if (pIVar3->ActiveId != owner_id && pIVar3->ActiveId != 0) {
    if ((uVar12 >> 10 & 1) != 0) {
      return false;
    }
    if (((((pIVar3->IO).WantTextInput == true) &&
         ((key & (ImGuiKey_ModAlt|ImGuiKey_ModCtrl)) != ImGuiKey_ModCtrl)) &&
        (((key >> 0xc & 1) == 0 || ((GImGui->IO).ConfigMacOSXBehaviors == false)))) &&
       (((GImGui->KeysMayBeCharInput).Storage
         [(int)((key & 0xffff0fe0) - ImGuiKey_NamedKey_BEGIN) >> 5] >> (key & 0x1f) & 1) != 0)) {
      if ((pIVar3->DebugLogFlags & 0x80) == 0) {
        return false;
      }
      pcVar7 = GetKeyChordName(key);
      fmt = 
      "SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> filtered as potential char input\n";
      bVar14 = false;
      goto LAB_00164e55;
    }
    if ((-1 < (short)uVar12) && (pIVar3->ActiveIdUsingAllKeyboardKeys == true)) {
      IVar5 = key & ~ImGuiMod_Mask_;
      if (IVar5 == ImGuiKey_KeysData_OFFSET) {
        IVar5 = ConvertSingleModFlagToKey(key);
      }
      if (0xffffff88 < IVar5 - ImGuiKey_GamepadStart) {
        return false;
      }
    }
  }
  if ((uVar12 >> 0x11 & 1) == 0) {
    pIVar9 = &pIVar3->CurrentFocusScopeId;
  }
  else {
    pIVar9 = &pIVar3->CurrentWindow->RootWindow->ID;
  }
  if ((uVar12 >> 0xb & 1) == 0) {
    if ((uVar12 >> 10 & 1) == 0) {
      uVar10 = 0;
      if (((uVar12 & 0x9000) == 0x1000) && (uVar10 = 2, (uVar12 >> 0xe & 1) == 0)) {
        uVar10 = 0xfe;
      }
      goto LAB_00164fe2;
    }
    if ((owner_id == 0) || (GImGui->ActiveId != owner_id)) {
      uVar10 = 0xff;
      goto LAB_00164fe2;
    }
  }
  else if ((owner_id == 0) || (GImGui->ActiveId != owner_id)) {
    uVar10 = 0xff;
    if (*pIVar9 != 0) {
      uVar1 = (GImGui->NavFocusRoute).Size;
      uVar11 = 0;
      uVar13 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar13 = uVar11;
      }
      for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
        if ((GImGui->NavFocusRoute).Data[uVar11].ID == *pIVar9) {
          uVar10 = (int)uVar11 + 3;
          break;
        }
      }
    }
    goto LAB_00164fe2;
  }
  uVar10 = 1;
LAB_00164fe2:
  if ((pIVar3->DebugLogFlags & 0x80) != 0) {
    pcVar7 = GetKeyChordName(key);
    DebugLog("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> score %d\n",pcVar7,
             (ulong)uVar12,(ulong)owner_id,(ulong)uVar10);
  }
  if (uVar10 == 0xff) {
    return false;
  }
  pIVar8 = GetShortcutRoutingData(key);
  if ((int)uVar10 < (int)(uint)pIVar8->RoutingNextScore) {
    pIVar8->RoutingNext = owner_id;
    pIVar8->RoutingNextScore = (ImU8)uVar10;
  }
  IVar6 = pIVar8->RoutingCurr;
  if ((pIVar8->RoutingCurr == owner_id) && (IVar6 = owner_id, (pIVar3->DebugLogFlags & 0x80) != 0))
  {
    DebugLog("--> granting current route\n");
    IVar6 = pIVar8->RoutingCurr;
  }
  return IVar6 == owner_id;
}

Assistant:

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiInputFlags_RouteTypeMask_) == 0)
        flags |= ImGuiInputFlags_RouteGlobal | ImGuiInputFlags_RouteOverFocused | ImGuiInputFlags_RouteOverActive; // IMPORTANT: This is the default for SetShortcutRouting() but NOT Shortcut()
    else
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiInputFlags_RouteTypeMask_)); // Check that only 1 routing flag is used
    IM_ASSERT(owner_id != ImGuiKeyOwner_Any && owner_id != ImGuiKeyOwner_NoOwner);
    if (flags & (ImGuiInputFlags_RouteOverFocused | ImGuiInputFlags_RouteOverActive | ImGuiInputFlags_RouteUnlessBgFocused))
        IM_ASSERT(flags & ImGuiInputFlags_RouteGlobal);

    // Add ImGuiMod_XXXX when a corresponding ImGuiKey_LeftXXX/ImGuiKey_RightXXX is specified.
    key_chord = FixupKeyChord(key_chord);

    // [DEBUG] Debug break requested by user
    if (g.DebugBreakInShortcutRouting == key_chord)
        IM_DEBUG_BREAK();

    if (flags & ImGuiInputFlags_RouteUnlessBgFocused)
        if (g.NavWindow == NULL)
            return false;

    // Note how ImGuiInputFlags_RouteAlways won't set routing and thus won't set owner. May want to rework this?
    if (flags & ImGuiInputFlags_RouteAlways)
    {
        IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> always, no register\n", GetKeyChordName(key_chord), flags, owner_id);
        return true;
    }

    // Specific culling when there's an active item.
    if (g.ActiveId != 0 && g.ActiveId != owner_id)
    {
        if (flags & ImGuiInputFlags_RouteActive)
            return false;

        // Cull shortcuts with no modifiers when it could generate a character.
        // e.g. Shortcut(ImGuiKey_G) also generates 'g' character, should not trigger when InputText() is active.
        // but  Shortcut(Ctrl+G) should generally trigger when InputText() is active.
        // TL;DR: lettered shortcut with no mods or with only Alt mod will not trigger while an item reading text input is active.
        // (We cannot filter based on io.InputQueueCharacters[] contents because of trickling and key<>chars submission order are undefined)
        if (g.IO.WantTextInput && IsKeyChordPotentiallyCharInput(key_chord))
        {
            IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> filtered as potential char input\n", GetKeyChordName(key_chord), flags, owner_id);
            return false;
        }

        // ActiveIdUsingAllKeyboardKeys trumps all for ActiveId
        if ((flags & ImGuiInputFlags_RouteOverActive) == 0 && g.ActiveIdUsingAllKeyboardKeys)
        {
            ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
            if (key == ImGuiKey_None)
                key = ConvertSingleModFlagToKey((ImGuiKey)(key_chord & ImGuiMod_Mask_));
            if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
                return false;
        }
    }

    // Where do we evaluate route for?
    ImGuiID focus_scope_id = g.CurrentFocusScopeId;
    if (flags & ImGuiInputFlags_RouteFromRootWindow)
        focus_scope_id = g.CurrentWindow->RootWindow->ID; // See PushFocusScope() call in Begin()

    const int score = CalcRoutingScore(focus_scope_id, owner_id, flags);
    IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> score %d\n", GetKeyChordName(key_chord), flags, owner_id, score);
    if (score == 255)
        return false;

    // Submit routing for NEXT frame (assuming score is sufficient)
    // FIXME: Could expose a way to use a "serve last" policy for same score resolution (using <= instead of <).
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord);
    //const bool set_route = (flags & ImGuiInputFlags_ServeLast) ? (score <= routing_data->RoutingNextScore) : (score < routing_data->RoutingNextScore);
    if (score < routing_data->RoutingNextScore)
    {
        routing_data->RoutingNext = owner_id;
        routing_data->RoutingNextScore = (ImU8)score;
    }

    // Return routing state for CURRENT frame
    if (routing_data->RoutingCurr == owner_id)
        IMGUI_DEBUG_LOG_INPUTROUTING("--> granting current route\n");
    return routing_data->RoutingCurr == owner_id;
}